

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_rdmsr_x86_64(CPUX86State *env)

{
  int iVar1;
  ArchCPU *pAVar2;
  uintptr_t unaff_retaddr;
  uint64_t uStack_20;
  uint32_t offset;
  uint64_t val;
  X86CPU *x86_cpu;
  CPUX86State *env_local;
  
  pAVar2 = env_archcpu(env);
  cpu_svm_check_intercept_param_x86_64(env,0x7c,0,unaff_retaddr);
  iVar1 = (int)env->regs[1];
  if (iVar1 == -0x3fffff80) {
    uStack_20 = env->efer;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3fffff7f) {
    uStack_20 = env->star;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3fffff7e) {
    uStack_20 = env->lstar;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3fffff7d) {
    uStack_20 = env->cstar;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3fffff7c) {
    uStack_20 = env->fmask;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3fffff00) {
    uStack_20 = env->segs[4].base;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3ffffeff) {
    uStack_20 = env->segs[5].base;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3ffffefe) {
    uStack_20 = env->kernelgsbase;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3ffffefd) {
    uStack_20 = env->tsc_aux;
    goto LAB_00537142;
  }
  if (iVar1 == -0x3ffefee9) {
    uStack_20 = env->vm_hsave;
    goto LAB_00537142;
  }
  if (iVar1 == 0x1b) {
    uStack_20 = 0;
    goto LAB_00537142;
  }
  if (iVar1 == 0x34) {
    uStack_20 = env->msr_smi_count;
    goto LAB_00537142;
  }
  if (iVar1 == 0x8b) {
    uStack_20 = pAVar2->ucode_rev;
    goto LAB_00537142;
  }
  if (iVar1 == 0xfe) {
    if ((env->features[0] & 0x1000) == 0) {
      uStack_20 = 0;
    }
    else {
      uStack_20 = 0x508;
    }
    goto LAB_00537142;
  }
  if (iVar1 == 0x174) {
    uStack_20 = (uint64_t)env->sysenter_cs;
    goto LAB_00537142;
  }
  if (iVar1 == 0x175) {
    uStack_20 = env->sysenter_esp;
    goto LAB_00537142;
  }
  if (iVar1 == 0x176) {
    uStack_20 = env->sysenter_eip;
    goto LAB_00537142;
  }
  if (iVar1 == 0x179) {
    uStack_20 = env->mcg_cap;
    goto LAB_00537142;
  }
  if (iVar1 == 0x17a) {
    uStack_20 = env->mcg_status;
    goto LAB_00537142;
  }
  if (iVar1 == 0x17b) {
    if ((env->mcg_cap & 0x100) == 0) {
      uStack_20 = 0;
    }
    else {
      uStack_20 = env->mcg_ctl;
    }
    goto LAB_00537142;
  }
  if (iVar1 == 0x198) {
    uStack_20 = 0x400000003e8;
    goto LAB_00537142;
  }
  if (iVar1 == 0x1a0) {
    uStack_20 = env->msr_ia32_misc_enable;
    goto LAB_00537142;
  }
  if (iVar1 == 0x200) {
LAB_00536f42:
    uStack_20 = env->mtrr_var[(int)env->regs[1] - 0x200U >> 1].base;
  }
  else {
    if (iVar1 != 0x201) {
      if (iVar1 == 0x202) goto LAB_00536f42;
      if (iVar1 != 0x203) {
        if (iVar1 == 0x204) goto LAB_00536f42;
        if (iVar1 != 0x205) {
          if (iVar1 == 0x206) goto LAB_00536f42;
          if (iVar1 != 0x207) {
            if (iVar1 == 0x208) goto LAB_00536f42;
            if (iVar1 != 0x209) {
              if (iVar1 == 0x20a) goto LAB_00536f42;
              if (iVar1 != 0x20b) {
                if (iVar1 == 0x20c) goto LAB_00536f42;
                if (iVar1 != 0x20d) {
                  if (iVar1 == 0x20e) goto LAB_00536f42;
                  if (iVar1 != 0x20f) {
                    if (iVar1 == 0x250) {
                      uStack_20 = env->mtrr_fixed[0];
                    }
                    else if (iVar1 - 600U < 2) {
                      uStack_20 = env->mtrr_fixed[(int)env->regs[1] - 599];
                    }
                    else if (iVar1 - 0x268U < 8) {
                      uStack_20 = env->mtrr_fixed[(int)env->regs[1] - 0x265];
                    }
                    else if (iVar1 == 0x277) {
                      uStack_20 = env->pat;
                    }
                    else if (iVar1 == 0x2ff) {
                      uStack_20 = env->mtrr_deftype;
                    }
                    else if (iVar1 == 0xd90) {
                      uStack_20 = env->msr_bndcfgs;
                    }
                    else if (((uint)env->regs[1] < 0x400) ||
                            ((env->mcg_cap & 0x3f) * 4 + 0x400 <= (env->regs[1] & 0xffffffff))) {
                      uStack_20 = 0;
                    }
                    else {
                      uStack_20 = env->mce_banks[(int)env->regs[1] - 0x400];
                    }
                    goto LAB_00537142;
                  }
                }
              }
            }
          }
        }
      }
    }
    uStack_20 = env->mtrr_var[(int)env->regs[1] - 0x201U >> 1].mask;
  }
LAB_00537142:
  env->regs[0] = uStack_20 & 0xffffffff;
  env->regs[2] = uStack_20 >> 0x20;
  return;
}

Assistant:

void helper_rdmsr(CPUX86State *env)
{
    X86CPU *x86_cpu = env_archcpu(env);
    uint64_t val;

    cpu_svm_check_intercept_param(env, SVM_EXIT_MSR, 0, GETPC());

    switch ((uint32_t)env->regs[R_ECX]) {
    case MSR_IA32_SYSENTER_CS:
        val = env->sysenter_cs;
        break;
    case MSR_IA32_SYSENTER_ESP:
        val = env->sysenter_esp;
        break;
    case MSR_IA32_SYSENTER_EIP:
        val = env->sysenter_eip;
        break;
    case MSR_IA32_APICBASE:
        val = 0; // cpu_get_apic_base(env_archcpu(env)->apic_state);
        break;
    case MSR_EFER:
        val = env->efer;
        break;
    case MSR_STAR:
        val = env->star;
        break;
    case MSR_PAT:
        val = env->pat;
        break;
    case MSR_VM_HSAVE_PA:
        val = env->vm_hsave;
        break;
    case MSR_IA32_PERF_STATUS:
        /* tsc_increment_by_tick */
        val = 1000ULL;
        /* CPU multiplier */
        val |= (((uint64_t)4ULL) << 40);
        break;
#ifdef TARGET_X86_64
    case MSR_LSTAR:
        val = env->lstar;
        break;
    case MSR_CSTAR:
        val = env->cstar;
        break;
    case MSR_FMASK:
        val = env->fmask;
        break;
    case MSR_FSBASE:
        val = env->segs[R_FS].base;
        break;
    case MSR_GSBASE:
        val = env->segs[R_GS].base;
        break;
    case MSR_KERNELGSBASE:
        val = env->kernelgsbase;
        break;
    case MSR_TSC_AUX:
        val = env->tsc_aux;
        break;
#endif
    case MSR_SMI_COUNT:
        val = env->msr_smi_count;
        break;
    case MSR_MTRRphysBase(0):
    case MSR_MTRRphysBase(1):
    case MSR_MTRRphysBase(2):
    case MSR_MTRRphysBase(3):
    case MSR_MTRRphysBase(4):
    case MSR_MTRRphysBase(5):
    case MSR_MTRRphysBase(6):
    case MSR_MTRRphysBase(7):
        val = env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                             MSR_MTRRphysBase(0)) / 2].base;
        break;
    case MSR_MTRRphysMask(0):
    case MSR_MTRRphysMask(1):
    case MSR_MTRRphysMask(2):
    case MSR_MTRRphysMask(3):
    case MSR_MTRRphysMask(4):
    case MSR_MTRRphysMask(5):
    case MSR_MTRRphysMask(6):
    case MSR_MTRRphysMask(7):
        val = env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                             MSR_MTRRphysMask(0)) / 2].mask;
        break;
    case MSR_MTRRfix64K_00000:
        val = env->mtrr_fixed[0];
        break;
    case MSR_MTRRfix16K_80000:
    case MSR_MTRRfix16K_A0000:
        val = env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                              MSR_MTRRfix16K_80000 + 1];
        break;
    case MSR_MTRRfix4K_C0000:
    case MSR_MTRRfix4K_C8000:
    case MSR_MTRRfix4K_D0000:
    case MSR_MTRRfix4K_D8000:
    case MSR_MTRRfix4K_E0000:
    case MSR_MTRRfix4K_E8000:
    case MSR_MTRRfix4K_F0000:
    case MSR_MTRRfix4K_F8000:
        val = env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                              MSR_MTRRfix4K_C0000 + 3];
        break;
    case MSR_MTRRdefType:
        val = env->mtrr_deftype;
        break;
    case MSR_MTRRcap:
        if (env->features[FEAT_1_EDX] & CPUID_MTRR) {
            val = MSR_MTRRcap_VCNT | MSR_MTRRcap_FIXRANGE_SUPPORT |
                MSR_MTRRcap_WC_SUPPORTED;
        } else {
            /* XXX: exception? */
            val = 0;
        }
        break;
    case MSR_MCG_CAP:
        val = env->mcg_cap;
        break;
    case MSR_MCG_CTL:
        if (env->mcg_cap & MCG_CTL_P) {
            val = env->mcg_ctl;
        } else {
            val = 0;
        }
        break;
    case MSR_MCG_STATUS:
        val = env->mcg_status;
        break;
    case MSR_IA32_MISC_ENABLE:
        val = env->msr_ia32_misc_enable;
        break;
    case MSR_IA32_BNDCFGS:
        val = env->msr_bndcfgs;
        break;
     case MSR_IA32_UCODE_REV:
        val = x86_cpu->ucode_rev;
        break;
    default:
        if ((uint32_t)env->regs[R_ECX] >= MSR_MC0_CTL
            && (uint32_t)env->regs[R_ECX] < MSR_MC0_CTL +
            (4 * env->mcg_cap & 0xff)) {
            uint32_t offset = (uint32_t)env->regs[R_ECX] - MSR_MC0_CTL;
            val = env->mce_banks[offset];
            break;
        }
        /* XXX: exception? */
        val = 0;
        break;
    }
    env->regs[R_EAX] = (uint32_t)(val);
    env->regs[R_EDX] = (uint32_t)(val >> 32);
}